

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O3

mh_int_t mh_assoc_put(mh_assoc_t *h,assoc_val **node,assoc_val ***ret,void *arg)

{
  uint uVar1;
  mh_int_t *pmVar2;
  assoc_val **ppaVar3;
  assoc_val *paVar4;
  uint32_t uVar5;
  int iVar6;
  assoc_val **in_RAX;
  sbyte sVar7;
  uint uVar8;
  assoc_val ***extraout_RDX;
  assoc_val ***extraout_RDX_00;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  
  if (h->size != h->n_buckets) {
    if (h->resize_position == 0) {
      if (h->upper_bound <= h->n_dirty) {
        arg = (void *)0x0;
        uVar8 = mh_assoc_start_resize(h,h->n_buckets + 1,0,(void *)0x0);
        in_RAX = (assoc_val **)(ulong)uVar8;
        ret = extraout_RDX_00;
        if (uVar8 != 0) goto LAB_00107aec;
      }
    }
    else {
      mh_assoc_resize(h,(void *)0x0);
      ret = extraout_RDX;
    }
    if (h->resize_position != 0) {
      mh_assoc_put(h->shadow,node,ret,arg);
    }
    uVar5 = PMurHash32(0xd,((*node)->key).id,((*node)->key).id_len);
    uVar8 = h->n_buckets;
    uVar14 = (ulong)uVar5 % (ulong)uVar8;
    iVar11 = uVar5 % (uVar8 - 1) + 1;
    pmVar2 = h->b;
    uVar9 = pmVar2[uVar14 >> 4];
    uVar13 = (uint)uVar14 & 0xf;
    sVar7 = (sbyte)uVar13;
    if ((uVar9 >> uVar13 & 1) != 0) {
      puVar12 = pmVar2 + (uVar14 >> 4);
      ppaVar3 = h->p;
      paVar4 = *node;
      do {
        uVar8 = (paVar4->key).id_len;
        if ((uVar8 == (ppaVar3[uVar14]->key).id_len) &&
           (iVar6 = bcmp((paVar4->key).id,(ppaVar3[uVar14]->key).id,(ulong)uVar8), iVar6 == 0))
        goto LAB_00107aa5;
        *puVar12 = uVar9 | 0x10000 << (sbyte)uVar13;
        uVar8 = h->n_buckets;
        uVar13 = (int)uVar14 + iVar11;
        uVar9 = uVar8;
        if (uVar13 < uVar8) {
          uVar9 = 0;
        }
        uVar13 = uVar13 - uVar9;
        uVar14 = (ulong)uVar13;
        puVar12 = pmVar2 + (uVar13 >> 4);
        uVar9 = *puVar12;
        uVar13 = uVar13 & 0xf;
        sVar7 = (sbyte)uVar13;
      } while ((uVar9 >> uVar13 & 1) != 0);
    }
    uVar10 = uVar14;
    for (uVar9 = uVar9 >> sVar7; (uVar9 >> 0x10 & 1) != 0; uVar9 = uVar9 >> (sbyte)(uVar13 & 0xf)) {
      uVar13 = (int)uVar10 + iVar11;
      uVar9 = 0;
      if (uVar8 <= uVar13) {
        uVar9 = uVar8;
      }
      uVar13 = uVar13 - uVar9;
      uVar10 = (ulong)uVar13;
      uVar9 = pmVar2[uVar13 >> 4];
      if ((uVar9 >> (uVar13 & 0xf) & 1) != 0) {
        uVar1 = (h->p[uVar10]->key).id_len;
        if ((uVar1 == ((*node)->key).id_len) &&
           (iVar6 = bcmp((h->p[uVar10]->key).id,((*node)->key).id,(ulong)uVar1), iVar6 == 0)) {
          uVar14 = (ulong)uVar13;
          break;
        }
      }
    }
LAB_00107aa5:
    uVar10 = uVar14 >> 4;
    uVar8 = (uint)uVar14 & 0xf;
    sVar7 = (sbyte)uVar8;
    if ((pmVar2[uVar10] >> uVar8 & 1) == 0) {
      pmVar2[uVar10] = 1 << sVar7 | pmVar2[uVar10];
      h->size = h->size + 1;
      if (((pmVar2[uVar10] >> sVar7) >> 0x10 & 1) == 0) {
        h->n_dirty = h->n_dirty + 1;
      }
    }
    in_RAX = h->p;
    in_RAX[uVar14] = *node;
  }
LAB_00107aec:
  return (mh_int_t)in_RAX;
}

Assistant:

static inline mh_int_t
_mh(put)(struct _mh(t) *h, const mh_node_t *node, mh_node_t **ret,
	 mh_arg_t arg)
{
	mh_int_t x = mh_end(h);
	int exist;
	if (h->size == h->n_buckets)
		/* no one free elements in the hash table */
		goto put_done;

#if MH_INCREMENTAL_RESIZE
	if (mh_unlikely(h->resize_position > 0))
		_mh(resize)(h, arg);
	else if (mh_unlikely(h->n_dirty >= h->upper_bound)) {
		if (_mh(start_resize)(h, h->n_buckets + 1, 0, arg))
			goto put_done;
	}
	if (h->resize_position)
		_mh(put)(h->shadow, node, NULL, arg);
#else
	if (mh_unlikely(h->n_dirty >= h->upper_bound)) {
		if (_mh(start_resize)(h, h->n_buckets + 1, h->size,
				      arg))
			goto put_done;
	}
#endif

	x = put_slot(h, node, arg);
	exist = mh_exist(h, x);

	if (!exist) {
		/* add new */
		mh_setexist(h, x);
		h->size++;
		if (!mh_dirty(h, x))
			h->n_dirty++;

		memcpy(&(h->p[x]), node, sizeof(mh_node_t));
		if (ret)
			*ret = NULL;
	} else {
		if (ret)
			memcpy(*ret, &(h->p[x]), sizeof(mh_node_t));
		/* replace old */
		memcpy(&(h->p[x]), node, sizeof(mh_node_t));
	}

put_done:
	return x;
}